

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

bool __thiscall TimerNode::isValid(TimerNode *this)

{
  TimerNode *in_RDI;
  size_t temp;
  timeval now;
  timeval local_20;
  bool local_1;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  local_1 = in_RDI->expiredTime_ <=
            (ulong)((local_20.tv_sec % 10000) * 1000 + local_20.tv_usec / 1000);
  if (local_1) {
    setDeleted(in_RDI);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

bool TimerNode::isValid(){
    struct timeval now;
    gettimeofday(&now, nullptr);
    size_t temp=(((now.tv_sec%10000)*1000)+(now.tv_usec/1000));
    if (temp<expiredTime_) {
        return true;
    }else {
        this->setDeleted();
        return false;
    }
}